

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_test.cpp
# Opt level: O0

void LogTest(void)

{
  double dVar1;
  Model *pMVar2;
  Model *pMVar3;
  System *s;
  System *t;
  long *plVar4;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  Model *local_10;
  Model *m;
  
  pMVar3 = (Model *)Model::createModel();
  local_10 = pMVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"sys1",&local_31);
  (**(code **)(*(long *)pMVar3 + 0x50))(0,pMVar3,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pMVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"sys2",&local_69);
  (**(code **)(*(long *)pMVar3 + 0x50))(0,pMVar3,local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pMVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"exp",&local_91);
  pMVar2 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"sys1",&local_b9);
  s = (System *)(**(code **)(*(long *)pMVar2 + 0x40))(pMVar2,local_b8);
  pMVar2 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"sys2",&local_e1);
  t = (System *)(**(code **)(*(long *)pMVar2 + 0x40))(pMVar2,local_e0);
  Model::createFlow<FlowLog>(pMVar3,(string *)local_90,s,t);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  (*(code *)**(undefined8 **)local_10)(local_10,0,100);
  pMVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"sys1",&local_109);
  plVar4 = (long *)(**(code **)(*(long *)pMVar3 + 0x40))(pMVar3,local_108);
  dVar1 = (double)(**(code **)(*plVar4 + 8))();
  if (0.0001 <= ABS(dVar1 - 88.2167)) {
    __assert_fail("fabs(m->findSystem(\"sys1\")->getValue() - 88.2167) < 0.0001",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                  ,0x18,"void LogTest()");
  }
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  pMVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"sys2",&local_131);
  plVar4 = (long *)(**(code **)(*(long *)pMVar3 + 0x40))(pMVar3,local_130);
  dVar1 = (double)(**(code **)(*plVar4 + 8))();
  if (ABS(dVar1 - 21.7833) < 0.0001) {
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    return;
  }
  __assert_fail("fabs(m->findSystem(\"sys2\")->getValue() - 21.7833) < 0.0001",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                ,0x19,"void LogTest()");
}

Assistant:

void LogTest() {
    auto *m = Model::createModel();
    m->createSystem("sys1", 100.0);
     m->createSystem("sys2", 10.0);
    m->createFlow<FlowLog>("exp", m->findSystem("sys1"), m->findSystem("sys2"));
    m->execute(0, 100);

    assert(fabs(m->findSystem("sys1")->getValue() - 88.2167) < 0.0001);
    assert(fabs(m->findSystem("sys2")->getValue() - 21.7833) < 0.0001);
}